

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_test.cpp
# Opt level: O2

void addGlobal(void)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  LockGuard lock;
  
  iVar2 = 200;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    LockGuard::LockGuard(&lock,&mutex);
    iVar1 = globalVal;
    usleep(1);
    globalVal = iVar1 + 1;
    LockGuard::~LockGuard(&lock);
  }
  return;
}

Assistant:

void addGlobal()
{
	int i = 0;
	while(i < 200)
	{
		LockGuard lock(mutex);
		int val = globalVal;
		val += 1;
		usleep(1);
		globalVal = val;
		++i;
	}
}